

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.cc
# Opt level: O1

void __thiscall test_typename_is_in_namespace::test_method(test_typename_is_in_namespace *this)

{
  undefined1 *local_478 [2];
  undefined1 local_468 [16];
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  byte local_438;
  undefined8 local_430;
  shared_count sStack_428;
  char *local_420;
  char *local_418;
  undefined **local_410;
  undefined1 local_408;
  undefined8 *local_400;
  char **local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2a);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/C","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/Type\" , \"/A/C\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_58 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x2b);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/C/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/Type\" , \"/A/C/\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_88 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2c);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/B/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/B/A","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/B/B/Type\" , \"/B/A\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_b8 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x2d);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/B/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/B/A/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/B/B/Type\" , \"/B/A/\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_e8 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x2e);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B/C","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/Type\" , \"/A/B/C\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_118 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x2f);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B/C/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/Type\" , \"/A/B/C/\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_148 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x30);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/C","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/Type\" , \"/A/C\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_178 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x31);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/C/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/Type\" , \"/A/C/\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_1a8 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x32);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/B/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/B/A","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/B/B/Type\" , \"/B/A\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_1d8 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x33);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/B/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/B/A/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/B/B/Type\" , \"/B/A/\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_208 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x34);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B/C","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/Type\" , \"/A/B/C\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_238 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x35);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B/C/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/Type\" , \"/A/B/C/\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_268 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x37);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/C/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/C/Type\" , \"/A/B\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_298 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x38);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/C/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_438 = local_438 ^ 1;
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "!isInNamespace(\"/A/B/C/Type\" , \"/A/B/\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_2c8 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x39);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "isInNamespace(\"/A/B/Type\" , \"/A/B\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_2f8 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x3a);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,false);
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "isInNamespace(\"/A/B/Type\" , \"/A/B/\" , false)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_328 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x3b);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/C/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "isInNamespace(\"/A/B/C/Type\" , \"/A/B\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_358 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x3c);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/C/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "isInNamespace(\"/A/B/C/Type\" , \"/A/B/\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_388 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x3d);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "isInNamespace(\"/A/B/Type\" , \"/A/B\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_3b8 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x3e);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"/A/B/Type","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"/A/B/","");
  local_438 = Typelib::isInNamespace((string *)local_458,(string *)local_478,true);
  local_430 = 0;
  sStack_428.pi_ = (sp_counted_base *)0x0;
  local_420 = "isInNamespace(\"/A/B/Type\" , \"/A/B/\" , true)";
  local_418 = "";
  local_408 = 0;
  local_410 = &PTR__lazy_ostream_00184330;
  local_400 = &boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_3e8 = "";
  local_3f8 = &local_420;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_428);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0]);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_typename_is_in_namespace )
{
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/C"    , false));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/C/"   , false));
    BOOST_CHECK(!isInNamespace("/B/B/Type" , "/B/A"    , false));
    BOOST_CHECK(!isInNamespace("/B/B/Type" , "/B/A/"   , false));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/B/C"  , false));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/B/C/" , false));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/C"    , true));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/C/"   , true));
    BOOST_CHECK(!isInNamespace("/B/B/Type" , "/B/A"    , true));
    BOOST_CHECK(!isInNamespace("/B/B/Type" , "/B/A/"   , true));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/B/C"  , true));
    BOOST_CHECK(!isInNamespace("/A/B/Type" , "/A/B/C/" , true));

    BOOST_CHECK(!isInNamespace("/A/B/C/Type" , "/A/B"  , false));
    BOOST_CHECK(!isInNamespace("/A/B/C/Type" , "/A/B/" , false));
    BOOST_CHECK( isInNamespace("/A/B/Type"   , "/A/B"  , false));
    BOOST_CHECK( isInNamespace("/A/B/Type"   , "/A/B/" , false));
    BOOST_CHECK( isInNamespace("/A/B/C/Type" , "/A/B"  , true));
    BOOST_CHECK( isInNamespace("/A/B/C/Type" , "/A/B/" , true));
    BOOST_CHECK( isInNamespace("/A/B/Type"   , "/A/B"  , true));
    BOOST_CHECK( isInNamespace("/A/B/Type"   , "/A/B/" , true));
}